

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O3

void test_cpp_wrapper_range
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int min_key,int max_key)

{
  long lVar1;
  ulong uVar2;
  Dictionary<int,_int> *pDVar3;
  planck_unit_test_t *ppVar4;
  int *expected_records;
  ion_boolean_t *piVar5;
  int iVar6;
  int iVar7;
  int key;
  undefined8 uStack_70;
  ion_boolean_t aiStack_68 [8];
  undefined8 uStack_60;
  int aiStack_58 [2];
  ulong local_50;
  Dictionary<int,_int> *local_48;
  planck_unit_test_t *local_40;
  int *local_38;
  
  local_48 = dict;
  local_40 = tc;
  local_50 = (ulong)((max_key - min_key) + 1);
  lVar1 = -(local_50 * 4 + 0xf & 0xfffffffffffffff0);
  local_38 = (int *)((long)aiStack_58 + lVar1);
  if (-5 < max_key) {
    iVar6 = max_key + 4;
    key = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    iVar7 = 0;
    do {
      ppVar4 = local_40;
      pDVar3 = local_48;
      *(undefined8 *)((long)&uStack_60 + lVar1) = 0x105005;
      cpp_wrapper_insert(ppVar4,pDVar3,key,key,'\x01');
      if (key <= max_key && min_key <= key) {
        local_38[iVar7] = key;
        iVar7 = iVar7 + 1;
      }
      key = key + 1;
    } while (iVar6 + 1 != key);
  }
  expected_records = local_38;
  ppVar4 = local_40;
  pDVar3 = local_48;
  uVar2 = local_50;
  piVar5 = aiStack_68 + lVar1;
  piVar5[0] = '\x01';
  piVar5[1] = '\0';
  piVar5[2] = '\0';
  piVar5[3] = '\0';
  piVar5[4] = '\0';
  piVar5[5] = '\0';
  piVar5[6] = '\0';
  piVar5[7] = '\0';
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10504b;
  cpp_wrapper_range(ppVar4,pDVar3,min_key,max_key,expected_records,(int)uVar2,aiStack_68[lVar1]);
  return;
}

Assistant:

void
test_cpp_wrapper_range(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int min_key,
	int max_key
) {
	/* records_expected is calculated the following way because it is min_key and max_key inclusive. */
	int records_expected	= max_key - min_key + 1;
	int curr_pos			= 0;
	int nums[records_expected];

	for (int i = 0; i < max_key + 5; i++) {
		cpp_wrapper_insert(tc, dict, i, i, boolean_true);

		if ((i >= min_key) && (i <= max_key)) {
			nums[curr_pos] = i;
			curr_pos++;
		}
	}

	cpp_wrapper_range(tc, dict, min_key, max_key, nums, records_expected, boolean_true);
}